

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_unaryOps_Test::TestBody(fixedPreciseMeasurement_unaryOps_Test *this)

{
  unit_data *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f8;
  Message local_f0;
  precise_unit local_e8;
  precise_unit local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  fixed_precise_measurement y;
  fixed_precise_measurement z;
  fixed_precise_measurement x;
  fixedPreciseMeasurement_unaryOps_Test *this_local;
  
  this_00 = &z.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)this_00,2.0,(precise_unit *)units::precise::cm);
  units::fixed_precise_measurement::operator-
            ((fixed_precise_measurement *)&y.units_.base_units_,(fixed_precise_measurement *)this_00
            );
  units::fixed_precise_measurement::operator+
            ((fixed_precise_measurement *)&gtest_ar.message_,(fixed_precise_measurement *)this_00);
  testing::internal::EqHelper::
  Compare<units::fixed_precise_measurement,_units::fixed_precise_measurement,_nullptr>
            ((EqHelper *)local_68,"y","x",(fixed_precise_measurement *)&gtest_ar.message_,
             (fixed_precise_measurement *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2fa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a0 = units::fixed_precise_measurement::value
                       ((fixed_precise_measurement *)&y.units_.base_units_);
  local_a8 = units::fixed_precise_measurement::value
                       ((fixed_precise_measurement *)&z.units_.base_units_);
  local_a8 = -local_a8;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_98,"z.value()","-x.value()",&local_a0,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2fb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_d8 = units::fixed_precise_measurement::units
                       ((fixed_precise_measurement *)&y.units_.base_units_);
  local_e8 = units::fixed_precise_measurement::units
                       ((fixed_precise_measurement *)&z.units_.base_units_);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c8,"z.units()","x.units()",&local_d8,&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2fc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, unaryOps)
{
    fixed_precise_measurement x(2.0, precise::cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}